

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O3

void __thiscall
Imf_2_5::ScanLineInputFile::ScanLineInputFile(ScanLineInputFile *this,InputPartData *part)

{
  size_t __n;
  InputStreamMutex *pIVar1;
  int iVar2;
  string *psVar3;
  Data *pDVar4;
  ArgExc *this_00;
  
  GenericInputFile::GenericInputFile(&this->super_GenericInputFile);
  (this->super_GenericInputFile)._vptr_GenericInputFile =
       (_func_int **)&PTR__ScanLineInputFile_0049d8a8;
  psVar3 = Header::type_abi_cxx11_(&part->header);
  __n = psVar3->_M_string_length;
  if (__n == _DAT_004a5128) {
    if (__n != 0) {
      iVar2 = bcmp((psVar3->_M_dataplus)._M_p,Imf_2_5::SCANLINEIMAGE_abi_cxx11_,__n);
      if (iVar2 != 0) goto LAB_001dbc98;
    }
    pDVar4 = (Data *)operator_new(0x168);
    Data::Data(pDVar4,part->numThreads);
    this->_data = pDVar4;
    pIVar1 = part->mutex;
    this->_streamData = pIVar1;
    iVar2 = (*pIVar1->is->_vptr_IStream[2])();
    pDVar4 = this->_data;
    pDVar4->memoryMapped = SUB41(iVar2,0);
    pDVar4->version = part->version;
    initialize(this,&part->header);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (&this->_data->lineOffsets,&part->chunkOffsets);
    pDVar4 = this->_data;
    pDVar4->partNumber = part->partNumber;
    pDVar4->fileIsComplete = true;
    return;
  }
LAB_001dbc98:
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(this_00,"Can\'t build a ScanLineInputFile from a type-mismatched part.");
  __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
}

Assistant:

ScanLineInputFile::ScanLineInputFile(InputPartData* part)
{
    if (part->header.type() != SCANLINEIMAGE)
        throw IEX_NAMESPACE::ArgExc("Can't build a ScanLineInputFile from a type-mismatched part.");

    _data = new Data(part->numThreads);
    _streamData = part->mutex;
    _data->memoryMapped = _streamData->is->isMemoryMapped();

    _data->version = part->version;

    try
    {
       initialize(part->header);
    }
    catch(...)
    {
        if (!_data->memoryMapped)
        {
            for (size_t i = 0; i < _data->lineBuffers.size(); i++)
            {
                if( _data->lineBuffers[i] )
                {
                   EXRFreeAligned(_data->lineBuffers[i]->buffer);
                   _data->lineBuffers[i]->buffer=nullptr;
                }
            }
        }
        
        delete _data;
        throw;
    }
    _data->lineOffsets = part->chunkOffsets;

    _data->partNumber = part->partNumber;
    //
    // (TODO) change this code later.
    // The completeness of the file should be detected in MultiPartInputFile.
    //
    _data->fileIsComplete = true;
}